

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::import_point
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  int local_7c;
  pair<const_int,_GEO::point> local_78;
  undefined1 local_50 [8];
  point input_point;
  int *line_number_local;
  string *import_path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *split_string_vector_local;
  geofile *this_local;
  
  input_point.char_len = (double)line_number;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,1);
  bVar1 = is_integer(pvVar2);
  if (bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,2);
    bVar1 = is_e_notation(pvVar2);
    if (!bVar1) goto LAB_00157414;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,3);
    bVar1 = is_e_notation(pvVar2);
    if (!bVar1) goto LAB_00157414;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,4);
    bVar1 = is_e_notation(pvVar2);
    if (!bVar1) goto LAB_00157414;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,5);
    bVar1 = is_e_notation(pvVar2);
    if (!bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](split_string_vector,5);
      bVar1 = std::operator==(pvVar2,"MeshSpac");
      if (!bVar1) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](split_string_vector,5);
        bVar1 = std::operator==(pvVar2,"cl__1");
        if (!bVar1) goto LAB_00157414;
      }
    }
  }
  else {
LAB_00157414:
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,5);
    bVar1 = std::operator==(pvVar2,";");
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error: Invalid value (line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)input_point.char_len);
      poVar3 = std::operator<<(poVar3," of ");
      poVar3 = std::operator<<(poVar3,(string *)import_path);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return 1;
    }
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,2);
  local_50 = (undefined1  [8])std::__cxx11::stod(pvVar2,(size_t *)0x0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,3);
  input_point.x = std::__cxx11::stod(pvVar2,(size_t *)0x0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,4);
  input_point.y = std::__cxx11::stod(pvVar2,(size_t *)0x0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,5);
  bVar1 = std::operator==(pvVar2,"MeshSpac");
  if (!bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](split_string_vector,5);
    bVar1 = std::operator==(pvVar2,"cl__1");
    if (!bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](split_string_vector,5);
      bVar1 = std::operator!=(pvVar2,";");
      if (bVar1) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](split_string_vector,5);
        input_point.z = std::__cxx11::stod(pvVar2,(size_t *)0x0);
      }
      else {
        input_point.z = 0.0;
      }
      goto LAB_0015753c;
    }
  }
  input_point.z = this->mesh_spacing;
LAB_0015753c:
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](split_string_vector,1);
  local_7c = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  std::pair<const_int,_GEO::point>::pair<int,_GEO::point_&,_true>
            (&local_78,&local_7c,(point *)local_50);
  std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
  insert(&this->points_map,&local_78);
  return 0;
}

Assistant:

int GEO::geofile::import_point( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ( (is_integer(split_string_vector[1])==true)&&
         (is_e_notation(split_string_vector[2])==true)&&
         (is_e_notation(split_string_vector[3])==true)&&
         (is_e_notation(split_string_vector[4])==true)&&
         ( (is_e_notation(split_string_vector[5])==true)||
           (split_string_vector[5]=="MeshSpac")||
           (split_string_vector[5]=="cl__1") )||
           (split_string_vector[5]==";") )
    {
        point input_point;
        input_point.x = std::stod(split_string_vector[2]);
        input_point.y = std::stod(split_string_vector[3]);
        input_point.z = std::stod(split_string_vector[4]);
        if( (split_string_vector[5]=="MeshSpac")||
            (split_string_vector[5]=="cl__1") )
        {
            input_point.char_len = mesh_spacing;
        }
        else
        {
            if (split_string_vector[5]!=";")
                input_point.char_len = std::stod(split_string_vector[5]);
            else
                input_point.char_len = 0;
        }
        points_map.insert({std::stoi(split_string_vector[1]), input_point});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
}